

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

void __thiscall QMakeParser::leaveScope(QMakeParser *this,ushort **tokPtr)

{
  QStack<QMakeParser::BlockScope> *this_00;
  ushort *puVar1;
  ushort *puVar2;
  ushort *puVar3;
  iterator iVar4;
  
  this_00 = &this->m_blockstack;
  iVar4 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  if (iVar4.i[-1].inBranch == true) {
    puVar2 = *tokPtr;
    *puVar2 = 0;
    *tokPtr = puVar2 + 2;
    puVar2[1] = 0;
  }
  iVar4 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  puVar2 = iVar4.i[-1].start;
  if (puVar2 != (ushort *)0x0) {
    puVar3 = *tokPtr;
    puVar1 = puVar3 + 1;
    *tokPtr = puVar1;
    *puVar3 = 0;
    *(int *)puVar2 = (int)((ulong)((long)puVar1 - (long)puVar2) >> 1) + -2;
  }
  QList<QMakeParser::BlockScope>::resize
            (&this_00->super_QList<QMakeParser::BlockScope>,
             (this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size + -1);
  return;
}

Assistant:

void QMakeParser::leaveScope(ushort *&tokPtr)
{
    if (m_blockstack.top().inBranch) {
        // Put empty else block
        putBlockLen(tokPtr, 0);
    }
    if (ushort *start = m_blockstack.top().start) {
        putTok(tokPtr, TokTerminator);
        uint len = tokPtr - start - 2;
        start[0] = (ushort)len;
        start[1] = (ushort)(len >> 16);
    }
    m_blockstack.resize(m_blockstack.size() - 1);
}